

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrEvaluationTest.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  double extraout_XMM0_Qa;
  double __val;
  double __val_00;
  double extraout_XMM0_Qa_00;
  double __val_01;
  double extraout_XMM0_Qa_01;
  double __val_02;
  Variable y;
  Variable x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  Variable local_f0;
  Variable local_d8;
  string local_c0;
  Expression local_a0;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  Kandinsky::Variable::Variable(&local_d8);
  Kandinsky::Variable::Variable(&local_f0);
  (local_d8.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       3.0;
  (local_f0.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       0.0;
  Kandinsky::operator||<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (&local_a0,&local_d8,&local_f0);
  (**(local_a0.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_BaseExpression)();
  (**((local_d8.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_c0,__val);
  std::operator+(&local_130,&local_c0," || ");
  (**((local_f0.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_88,__val_00);
  std::operator+(&local_110,&local_130,&local_88);
  std::operator+(&local_28,&local_110," != 1");
  Kandinsky::assertOrExit((bool)(-(extraout_XMM0_Qa == 1.0) & 1),&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_c0);
  Kandinsky::Expression::~Expression(&local_a0);
  local_c0._M_dataplus._M_p._0_4_ = 1;
  Kandinsky::operator||<Kandinsky::Variable,_int,_nullptr>
            ((Expression *)&local_130,&local_d8,(int *)&local_c0);
  (*(code *)**(undefined8 **)local_130._M_string_length)();
  (**((local_d8.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_110,__val_01);
  std::operator+(&local_48,&local_110," || 1 != 1");
  Kandinsky::assertOrExit((bool)(-(extraout_XMM0_Qa_00 == 1.0) & 1),&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_110);
  Kandinsky::Expression::~Expression((Expression *)&local_130);
  local_88._M_dataplus._M_p._0_4_ = 0;
  Kandinsky::operator||<int,_Kandinsky::Variable,_nullptr>
            ((Expression *)&local_c0,(int *)&local_88,&local_f0);
  (*(code *)**(undefined8 **)local_c0._M_string_length)();
  (**((local_f0.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_130,__val_02);
  std::operator+(&local_110,"0 || ",&local_130);
  std::operator+(&local_68,&local_110," != 0");
  Kandinsky::assertOrExit((bool)(-(extraout_XMM0_Qa_01 == 0.0) & 1),&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  Kandinsky::Expression::~Expression((Expression *)&local_c0);
  Kandinsky::Variable::~Variable(&local_f0);
  Kandinsky::Variable::~Variable(&local_d8);
  return 0;
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    Variable y;
    x.setValue(3);
    y.setValue(0);
    assertOrExit((x || y).evaluate() == 1, std::to_string(x.evaluate()) + " || " + std::to_string(y.evaluate()) + " != 1");
    assertOrExit((x || 1).evaluate() == 1, std::to_string(x.evaluate()) + " || 1 != 1");
    assertOrExit((0 || y).evaluate() == 0, "0 || " + std::to_string(y.evaluate()) + " != 0");
    return 0;
}